

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergeFrom
          (CodeGeneratorRequest *this,CodeGeneratorRequest *from)

{
  uint uVar1;
  CodeGeneratorRequest *pCVar2;
  LogMessage *other;
  uint32_t *puVar3;
  Arena *pAVar4;
  Version *this_00;
  Version *from_00;
  LogFinisher local_75;
  uint32_t cached_has_bits;
  byte local_61;
  LogMessage local_60;
  CodeGeneratorRequest *local_28;
  CodeGeneratorRequest *from_local;
  CodeGeneratorRequest *this_local;
  CodeGeneratorRequest *local_10;
  
  local_61 = 0;
  local_28 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x344);
    local_61 = 1;
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_75,other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->file_to_generate_,&local_28->file_to_generate_);
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::MergeFrom
            (&this->proto_file_,&local_28->proto_file_);
  puVar3 = internal::HasBits<1UL>::operator[](&local_28->_has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      this_local = (CodeGeneratorRequest *)_internal_parameter_abi_cxx11_(local_28);
      local_10 = this;
      puVar3 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
      pCVar2 = this_local;
      *puVar3 = *puVar3 | 1;
      pAVar4 = MessageLite::GetArenaForAllocation((MessageLite *)this);
      internal::ArenaStringPtr::Set(&this->parameter_,pCVar2,pAVar4);
    }
    if ((uVar1 & 2) != 0) {
      this_00 = _internal_mutable_compiler_version(this);
      from_00 = _internal_compiler_version(local_28);
      Version::MergeFrom(this_00,from_00);
    }
  }
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(local_28->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void CodeGeneratorRequest::MergeFrom(const CodeGeneratorRequest& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorRequest)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  file_to_generate_.MergeFrom(from.file_to_generate_);
  proto_file_.MergeFrom(from.proto_file_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_parameter(from._internal_parameter());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_compiler_version()->::PROTOBUF_NAMESPACE_ID::compiler::Version::MergeFrom(from._internal_compiler_version());
    }
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}